

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O2

void __thiscall
leveldb::VersionSet::GetRange2
          (VersionSet *this,
          vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *inputs1,
          vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *inputs2,
          InternalKey *smallest,InternalKey *largest)

{
  long in_FS_OFFSET;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> all;
  _Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> _Stack_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::vector
            ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)&_Stack_48
             ,inputs1);
  std::vector<leveldb::FileMetaData*,std::allocator<leveldb::FileMetaData*>>::
  insert<__gnu_cxx::__normal_iterator<leveldb::FileMetaData*const*,std::vector<leveldb::FileMetaData*,std::allocator<leveldb::FileMetaData*>>>,void>
            ((vector<leveldb::FileMetaData*,std::allocator<leveldb::FileMetaData*>> *)&_Stack_48,
             (const_iterator)_Stack_48._M_impl.super__Vector_impl_data._M_finish,
             (__normal_iterator<leveldb::FileMetaData_*const_*,_std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>_>
              )(inputs2->
               super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
               )._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<leveldb::FileMetaData_*const_*,_std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>_>
              )(inputs2->
               super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
               )._M_impl.super__Vector_impl_data._M_finish);
  GetRange(this,(vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
                &_Stack_48,smallest,largest);
  std::_Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::
  ~_Vector_base(&_Stack_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void VersionSet::GetRange2(const std::vector<FileMetaData*>& inputs1,
                           const std::vector<FileMetaData*>& inputs2,
                           InternalKey* smallest, InternalKey* largest) {
  std::vector<FileMetaData*> all = inputs1;
  all.insert(all.end(), inputs2.begin(), inputs2.end());
  GetRange(all, smallest, largest);
}